

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmutil.c
# Opt level: O0

int Pm_QueueFull(PmQueue *q)

{
  PmQueueRep *queue;
  int i;
  long tail;
  PmQueue *q_local;
  
  if (q == (PmQueue *)0x0) {
    q_local._4_4_ = -0x270b;
  }
  else {
    for (queue._4_4_ = 0; queue._4_4_ < *(int *)((long)q + 0x20); queue._4_4_ = queue._4_4_ + 1) {
      if (*(int *)(*(long *)((long)q + 0x28) + (*(long *)((long)q + 8) + (long)queue._4_4_) * 4) !=
          0) {
        return 1;
      }
    }
    q_local._4_4_ = 0;
  }
  return q_local._4_4_;
}

Assistant:

PMEXPORT int Pm_QueueFull(PmQueue *q)
{
    long tail;
    int i; 
    PmQueueRep *queue = (PmQueueRep *) q;
    /* arg checking */
    if (!queue)
        return pmBadPtr;
    tail = queue->tail;
    /* test to see if there is space in the queue */
    for (i = 0; i < queue->msg_size; i++) {
        if (queue->buffer[tail + i]) {
            return TRUE;
        }
    }
    return FALSE;
}